

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

TCGv_i32 do_reduction_op(DisasContext_conflict1 *s,int fpopcode,int rn,int esize,int size,int vmap,
                        TCGv_ptr fpst)

{
  TCGContext_conflict1 *pTVar1;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  byte bVar5;
  uint uVar6;
  code *func;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i32 tcg_dest;
  uintptr_t o_1;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_ptr local_48;
  TCGContext_conflict1 *local_38;
  
  pTVar1 = s->uc->tcg_ctx;
  if (esize == size) {
    bVar5 = (byte)vmap - 1;
    if ((byte)((byte)vmap ^ bVar5) <= bVar5) {
      __assert_fail("ctpop8(vmap) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cf9,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    if (vmap == 0) {
      uVar6 = 0x20;
    }
    else {
      uVar6 = 0;
      if (vmap != 0) {
        for (; ((uint)vmap >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
    }
    if (7 < uVar6) {
      __assert_fail("element < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x1cfb,
                    "TCGv_i32 do_reduction_op(DisasContext *, int, int, int, int, int, TCGv_ptr)");
    }
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    tcg_dest = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
    read_vec_element_i32
              ((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest,rn,uVar6,(esize != 0x10) + MO_16);
  }
  else {
    uVar6 = vmap >> (byte)(((vmap & 0xffU) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1d) &
            vmap;
    local_38 = pTVar1;
    pTVar2 = do_reduction_op(s,fpopcode,rn,esize,(uint)size >> 1,vmap ^ uVar6,fpst);
    pTVar1 = local_38;
    pTVar3 = do_reduction_op(s,fpopcode,rn,esize,(uint)size >> 1,uVar6,fpst);
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    tcg_dest = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
    if (fpopcode < 0x2c) {
      if (fpopcode < 0x1c) {
        if (fpopcode == 0xc) {
          func = helper_advsimd_maxnumh_aarch64;
        }
        else {
          if (fpopcode != 0xf) {
LAB_006b6b79:
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x1d25,(char *)0x0);
          }
          func = helper_advsimd_maxh_aarch64;
        }
      }
      else if (fpopcode == 0x1c) {
        func = helper_advsimd_minnumh_aarch64;
      }
      else {
        if (fpopcode != 0x1f) goto LAB_006b6b79;
        func = helper_advsimd_minh_aarch64;
      }
    }
    else if (fpopcode < 0x3c) {
      if (fpopcode == 0x2c) {
        func = helper_vfp_maxnums_aarch64;
      }
      else {
        if (fpopcode != 0x2f) goto LAB_006b6b79;
        func = helper_vfp_maxs_aarch64;
      }
    }
    else if (fpopcode == 0x3c) {
      func = helper_vfp_minnums_aarch64;
    }
    else {
      if (fpopcode != 0x3f) goto LAB_006b6b79;
      func = helper_vfp_mins_aarch64;
    }
    local_48 = fpst + (long)pTVar1;
    local_50 = pTVar2 + (long)&pTVar1->pool_cur;
    local_58 = (TCGTemp *)(pTVar3 + (long)&pTVar1->pool_cur);
    tcg_gen_callN_aarch64(pTVar1,func,(TCGTemp *)((long)pTVar1 + (long)tcg_dest),3,&local_58);
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar2 + (long)pTVar1));
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar3 + (long)pTVar1));
  }
  return tcg_dest;
}

Assistant:

static TCGv_i32 do_reduction_op(DisasContext *s, int fpopcode, int rn,
                                int esize, int size, int vmap, TCGv_ptr fpst)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (esize == size) {
        int element;
        MemOp msize = esize == 16 ? MO_16 : MO_32;
        TCGv_i32 tcg_elem;

        /* We should have one register left here */
        assert(ctpop8(vmap) == 1);
        element = ctz32(vmap);
        assert(element < 8);

        tcg_elem = tcg_temp_new_i32(tcg_ctx);
        read_vec_element_i32(s, tcg_elem, rn, element, msize);
        return tcg_elem;
    } else {
        int bits = size / 2;
        int shift = ctpop8(vmap) / 2;
        int vmap_lo = (vmap >> shift) & vmap;
        int vmap_hi = (vmap & ~vmap_lo);
        TCGv_i32 tcg_hi, tcg_lo, tcg_res;

        tcg_hi = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_hi, fpst);
        tcg_lo = do_reduction_op(s, fpopcode, rn, esize, bits, vmap_lo, fpst);
        tcg_res = tcg_temp_new_i32(tcg_ctx);

        switch (fpopcode) {
        case 0x0c: /* fmaxnmv half-precision */
            gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x0f: /* fmaxv half-precision */
            gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1c: /* fminnmv half-precision */
            gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x1f: /* fminv half-precision */
            gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2c: /* fmaxnmv */
            gen_helper_vfp_maxnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x2f: /* fmaxv */
            gen_helper_vfp_maxs(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3c: /* fminnmv */
            gen_helper_vfp_minnums(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        case 0x3f: /* fminv */
            gen_helper_vfp_mins(tcg_ctx, tcg_res, tcg_lo, tcg_hi, fpst);
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_hi);
        tcg_temp_free_i32(tcg_ctx, tcg_lo);
        return tcg_res;
    }
}